

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::ConfidentialTransaction::ConvertToByteData
          (ByteData *__return_storage_ptr__,uint8_t *data,size_t size)

{
  uchar *__dest;
  undefined1 *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t size_local;
  uint8_t *data_local;
  
  __n = &local_39;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)size;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a8f14);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffb0,(size_type)__n,(allocator_type *)size);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a8f30);
  if ((data != (uint8_t *)0x0) &&
     (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
    __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a8f47);
    memcpy(__dest,data,
           (size_t)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)size);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::ConvertToByteData(
    const uint8_t *data, size_t size) {
  std::vector<uint8_t> buffer(size);
  if ((data != nullptr) && (size != 0)) {
    memcpy(buffer.data(), data, size);
  }
  return ByteData(buffer);
}